

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.c
# Opt level: O3

void appPaint(ATimeUs timestamp,float dt)

{
  float fVar1;
  
  fps_1 = fps_1 + dt;
  fps_2 = (float)(~-(uint)(fps_2 <= dt) & (uint)dt |
                 (~-(uint)(fps_2 != 0.0) & (uint)dt | -(uint)(fps_2 != 0.0) & (uint)fps_2) &
                 -(uint)(fps_2 <= dt));
  if (dt <= fps_3) {
    dt = fps_3;
  }
  fps_4 = fps_4 + 1;
  fps_3 = dt;
  if (1000000 < timestamp - fps_0) {
    fVar1 = (float)(timestamp - fps_0) * 1e-06;
    aAppDebugPrintf("%s[%u]: elapsed: %.2fs, frames = %d, min_dt = %.2fms, avg_dt = %.2fms, max_dt = %.2fms, avg_fps = %.2f"
                    ,SUB84((double)fVar1,0),(double)fps_2 * 1000.0,
                    ((double)fps_1 * 1000.0) / (double)fps_4,(double)dt * 1000.0,
                    (double)((float)fps_4 / fVar1),"appPaint",(ulong)timestamp);
    fps_4 = 0;
    fps_3 = 0.0;
    fps_1 = 0.0;
    fps_2 = 0.0;
    fps_0 = timestamp;
  }
  return;
}

Assistant:

static void appPaint(ATimeUs timestamp, float dt) {
	fps.dt += dt;
	fps.min_dt = (fps.min_dt > dt || !fps.min_dt) ? dt : fps.min_dt;
	fps.max_dt = (fps.max_dt < dt) ? dt : fps.max_dt;
	++fps.frames;
	if (timestamp - fps.time > 1000000) {
		float sec = (timestamp - fps.time) * 1e-6f;
		aAppDebugPrintf(
			"%s[%u]: elapsed: %.2fs, frames = %d, "
			"min_dt = %.2fms, avg_dt = %.2fms, max_dt = %.2fms, avg_fps = %.2f",
			__func__, timestamp, sec, fps.frames, fps.min_dt * 1e3, fps.dt * 1e3 / fps.frames, fps.max_dt * 1e3,
			fps.frames / sec);
		fps.frames = 0;
		fps.min_dt = fps.dt = fps.max_dt = 0;
		fps.time = timestamp;
	}
}